

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O0

int mbedtls_rsa_parse_pubkey(mbedtls_rsa_context *rsa,uchar *key,size_t keylen)

{
  int iVar1;
  mbedtls_rsa_context *pmVar2;
  uchar *P;
  mbedtls_rsa_context *ctx;
  size_t in_RDX;
  uchar *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  size_t len;
  int ret;
  uchar *end;
  uchar *p;
  size_t *in_stack_ffffffffffffff98;
  size_t *len_00;
  mbedtls_rsa_context *ctx_00;
  uchar *in_stack_ffffffffffffffa0;
  uchar *end_00;
  uchar **in_stack_ffffffffffffffa8;
  uchar **p_00;
  uchar *in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc8;
  uchar *D;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  pmVar2 = (mbedtls_rsa_context *)(in_RSI + in_RDX);
  D = in_RSI;
  iVar1 = mbedtls_asn1_get_tag
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0
                    );
  if (iVar1 == 0) {
    if (pmVar2 == (mbedtls_rsa_context *)(in_RSI + (long)in_stack_ffffffffffffffc0)) {
      iVar1 = mbedtls_asn1_get_tag
                        (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff98,0);
      if (iVar1 == 0) {
        len_00 = (size_t *)0x0;
        end_00 = (uchar *)0x0;
        p_00 = (uchar **)0x0;
        iVar1 = mbedtls_rsa_import_raw
                          ((mbedtls_rsa_context *)(ulong)in_stack_ffffffffffffffc8,
                           in_stack_ffffffffffffffc0,0,(uchar *)0x0,0,(uchar *)0x0,in_RDX,D,in_RDI,
                           (uchar *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           unaff_retaddr);
        if (iVar1 == 0) {
          P = in_stack_ffffffffffffffc0 + (long)in_RSI;
          iVar1 = mbedtls_asn1_get_tag(p_00,end_00,len_00,0);
          if (iVar1 == 0) {
            ctx_00 = (mbedtls_rsa_context *)0x0;
            iVar1 = mbedtls_rsa_import_raw
                              ((mbedtls_rsa_context *)(ulong)in_stack_ffffffffffffffc8,
                               in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffc0,P,0,
                               (uchar *)0x0,in_RDX,D,in_RDI,
                               (uchar *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8
                                                ),unaff_retaddr);
            if (iVar1 == 0) {
              ctx = (mbedtls_rsa_context *)(in_stack_ffffffffffffffc0 + (long)P);
              iVar1 = mbedtls_rsa_complete(ctx);
              if ((iVar1 == 0) && (iVar1 = mbedtls_rsa_check_pubkey(ctx_00), iVar1 == 0)) {
                if (ctx == pmVar2) {
                  iVar1 = 0;
                }
                else {
                  iVar1 = -0x66;
                }
              }
              else {
                iVar1 = -0x4080;
              }
            }
            else {
              iVar1 = -0x4080;
            }
          }
        }
        else {
          iVar1 = -0x4080;
        }
      }
    }
    else {
      iVar1 = -0x4080;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_rsa_parse_pubkey(mbedtls_rsa_context *rsa, const unsigned char *key, size_t keylen)
{
    unsigned char *p = (unsigned char *) key;
    unsigned char *end = (unsigned char *) (key + keylen);
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    /*
     *  RSAPublicKey ::= SEQUENCE {
     *      modulus           INTEGER,  -- n
     *      publicExponent    INTEGER   -- e
     *  }
     */

    if ((ret = mbedtls_asn1_get_tag(&p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return ret;
    }

    if (end != p + len) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    /* Import N */
    if ((ret = mbedtls_asn1_get_tag(&p, end, &len, MBEDTLS_ASN1_INTEGER)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_rsa_import_raw(rsa, p, len, NULL, 0, NULL, 0,
                                      NULL, 0, NULL, 0)) != 0) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    p += len;

    /* Import E */
    if ((ret = mbedtls_asn1_get_tag(&p, end, &len, MBEDTLS_ASN1_INTEGER)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_rsa_import_raw(rsa, NULL, 0, NULL, 0, NULL, 0,
                                      NULL, 0, p, len)) != 0) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    p += len;

    if (mbedtls_rsa_complete(rsa) != 0 ||
        mbedtls_rsa_check_pubkey(rsa) != 0) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    if (p != end) {
        return MBEDTLS_ERR_ASN1_LENGTH_MISMATCH;
    }

    return 0;
}